

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O3

void __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet
          (BasicSuffixSet<std::allocator<char>_> *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->_vptr_BasicSuffixSet = (_func_int **)&PTR__BasicSuffixSet_00445370;
  for (p_Var1 = (this->set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->set_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    operator_delete(*(void **)(p_Var1 + 1),(ulong)((long)&(p_Var1[1]._M_parent)->_M_color + 1));
    operator_delete(p_Var1[1]._M_right,
                    (long)*(int *)((long)&p_Var1[1]._M_left + 4) <<
                    (((ulong)p_Var1[1]._M_left & 4) == 0 ^ 3U));
  }
  std::
  _Rb_tree<mp::internal::SuffixBase::Impl,_mp::internal::SuffixBase::Impl,_std::_Identity<mp::internal::SuffixBase::Impl>,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  ::~_Rb_tree(&(this->set_)._M_t);
  return;
}

Assistant:

BasicSuffixSet<Alloc>::~BasicSuffixSet() {
  /// Deallocate names and values.
  for (typename Set::iterator i = set_.begin(), e = set_.end(); i != e; ++i) {
    Deallocate(const_cast<char*>(i->name.data()), i->name.size()+1);
    if ((i->kind & suf::FLOAT) != 0)
      Deallocate(i->dbl_values, i->num_values);
    else
      Deallocate(i->int_values, i->num_values);
  }
}